

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"networks/sis33.m",&local_29);
  BasicTests::Capacitor_Test_GA((string *)local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return 0;
}

Assistant:

int main() {
//    BasicTests::readNetworkTest("networks/sis33.m");
//    BasicTests::testRandomKeys("networks/sis33.m");
    BasicTests::Capacitor_Test_GA("networks/sis33.m");
}